

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O2

void helper_lldt_x86_64(CPUX86State *env,int selector)

{
  target_ulong *ptVar1;
  abi_ptr addr;
  target_ulong tVar2;
  uint uVar3;
  int iVar4;
  uint32_t e1;
  uint32_t e2;
  uint32_t uVar5;
  uintptr_t unaff_retaddr;
  uint local_38;
  
  if ((selector & 0xfffcU) == 0) {
    (env->ldt).base = 0;
    (env->ldt).limit = 0;
LAB_004d706c:
    (env->ldt).selector = selector & 0xffff;
    return;
  }
  if ((selector & 4U) != 0) {
    raise_exception_err_ra_x86_64(env,0xd,selector & 0xfffcU,unaff_retaddr);
  }
  local_38 = selector & 0xfffc;
  uVar3 = selector & 0xfff8;
  if ((env->gdt).limit < uVar3 + (uint)((*(byte *)((long)&env->hflags + 1) & 0x40) >> 6) * 8 + 7) {
    raise_exception_err_ra_x86_64(env,0xd,local_38,unaff_retaddr);
  }
  tVar2 = (env->gdt).base;
  addr = uVar3 + tVar2;
  iVar4 = cpu_mmu_index_kernel(env);
  e1 = cpu_ldl_mmuidx_ra_x86_64(env,addr,iVar4,unaff_retaddr);
  iVar4 = cpu_mmu_index_kernel(env);
  e2 = cpu_ldl_mmuidx_ra_x86_64(env,tVar2 + uVar3 + 4,iVar4,unaff_retaddr);
  if ((e2 & 0x1f00) == 0x200) {
    if ((short)e2 < 0) {
      if ((env->hflags & 0x4000) == 0) {
        load_seg_cache_raw_dt(&env->ldt,e1,e2);
      }
      else {
        iVar4 = cpu_mmu_index_kernel(env);
        uVar5 = cpu_ldl_mmuidx_ra_x86_64(env,addr + 8,iVar4,unaff_retaddr);
        load_seg_cache_raw_dt(&env->ldt,e1,e2);
        ptVar1 = &(env->ldt).base;
        *ptVar1 = *ptVar1 | (ulong)uVar5 << 0x20;
      }
      goto LAB_004d706c;
    }
    iVar4 = 0xb;
  }
  else {
    iVar4 = 0xd;
  }
  raise_exception_err_ra_x86_64(env,iVar4,local_38,unaff_retaddr);
}

Assistant:

void helper_lldt(CPUX86State *env, int selector)
{
    SegmentCache *dt;
    uint32_t e1, e2;
    int index, entry_limit;
    target_ulong ptr;

    selector &= 0xffff;
    if ((selector & 0xfffc) == 0) {
        /* XXX: NULL selector case: invalid LDT */
        env->ldt.base = 0;
        env->ldt.limit = 0;
    } else {
        if (selector & 0x4) {
            raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
        }
        dt = &env->gdt;
        index = selector & ~7;
#ifdef TARGET_X86_64
        if (env->hflags & HF_LMA_MASK) {
            entry_limit = 15;
        } else
#endif
        {
            entry_limit = 7;
        }
        if ((index + entry_limit) > dt->limit) {
            raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
        }
        ptr = dt->base + index;
        e1 = cpu_ldl_kernel_ra(env, ptr, GETPC());
        e2 = cpu_ldl_kernel_ra(env, ptr + 4, GETPC());
        if ((e2 & DESC_S_MASK) || ((e2 >> DESC_TYPE_SHIFT) & 0xf) != 2) {
            raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
        }
        if (!(e2 & DESC_P_MASK)) {
            raise_exception_err_ra(env, EXCP0B_NOSEG, selector & 0xfffc, GETPC());
        }
#ifdef TARGET_X86_64
        if (env->hflags & HF_LMA_MASK) {
            uint32_t e3;

            e3 = cpu_ldl_kernel_ra(env, ptr + 8, GETPC());
            load_seg_cache_raw_dt(&env->ldt, e1, e2);
            env->ldt.base |= (target_ulong)e3 << 32;
        } else
#endif
        {
            load_seg_cache_raw_dt(&env->ldt, e1, e2);
        }
    }
    env->ldt.selector = selector;
}